

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

split_helper_index<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
* __thiscall
detail::
split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
::operator[](split_helper_index<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
             *__return_storage_ptr__,
            split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
            *this,size_t n)

{
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)this);
  __return_storage_ptr__->index = n;
  return __return_storage_ptr__;
}

Assistant:

split_helper_index<StlString, false, false, true> operator[](size_t n) const noexcept { return{ std::move(delim), n }; }